

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
VectorInstance::receive
          (VectorInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  VectorInstance *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  VectorInstance *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000030;
  VectorInstance *in_stack_00000038;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  VectorInstance *in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000050;
  VectorInstance *in_stack_00000058;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000060;
  VectorInstance *in_stack_00000068;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  VectorInstance *in_stack_00000098;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000a0;
  VectorInstance *in_stack_000000a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000b0;
  VectorInstance *in_stack_000000b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000c0;
  VectorInstance *in_stack_000000c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000d0;
  VectorInstance *in_stack_000000d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000120;
  VectorInstance *in_stack_00000128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_RDI);
  if (bVar1) {
    op_get(in_RDX,in_RCX);
  }
  else {
    bVar1 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar1) {
      op_isEmpty(in_stack_00000008,unaff_retaddr);
    }
    else {
      bVar1 = std::operator==(__lhs,(char *)in_RDI);
      if (bVar1) {
        op_contains(in_stack_00000058,in_stack_00000050);
      }
      else {
        bVar1 = std::operator==(__lhs,(char *)in_RDI);
        if (bVar1) {
          op_contains_fromIndex(in_stack_000000c8,in_stack_000000c0);
        }
        else {
          bVar1 = std::operator==(__lhs,(char *)in_RDI);
          if (bVar1) {
            op_count(in_stack_00000098,in_stack_00000090);
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)in_RDI);
            if (bVar1) {
              op_atIndex(in_stack_00000058,in_stack_00000050);
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)in_RDI);
              if (bVar1) {
                op_firstIndexOf(in_stack_000000b8,in_stack_000000b0);
              }
              else {
                bVar1 = std::operator==(__lhs,(char *)in_RDI);
                if (bVar1) {
                  op_firstIndexOf_fromIndex(in_stack_00000128,in_stack_00000120);
                }
                else {
                  bVar1 = std::operator==(__lhs,(char *)in_RDI);
                  if (bVar1) {
                    op_allIndexesOf(in_stack_00000098,in_stack_00000090);
                  }
                  else {
                    bVar1 = std::operator==(__lhs,(char *)in_RDI);
                    if (bVar1) {
                      op_size(in_stack_00000058,in_stack_00000050);
                    }
                    else {
                      bVar1 = std::operator==(__lhs,(char *)in_RDI);
                      if (bVar1) {
                        op_first(in_stack_000000b8,in_stack_000000b0);
                      }
                      else {
                        bVar1 = std::operator==(__lhs,(char *)in_RDI);
                        if (bVar1) {
                          op_last(in_stack_000000b8,in_stack_000000b0);
                        }
                        else {
                          bVar1 = std::operator==(__lhs,(char *)in_RDI);
                          if (bVar1) {
                            op_sliceFromIndex(in_stack_000000a8,in_stack_000000a0);
                          }
                          else {
                            bVar1 = std::operator==(__lhs,(char *)in_RDI);
                            if (bVar1) {
                              op_sliceFromIndex_toIndex(in_stack_00000128,in_stack_00000120);
                            }
                            else {
                              bVar1 = std::operator==(__lhs,(char *)in_RDI);
                              if (bVar1) {
                                op_pushBack((VectorInstance *)arguments,in_stack_00000010);
                              }
                              else {
                                bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                if (bVar1) {
                                  op_pushFront(in_stack_00000048,in_stack_00000040);
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                  if (bVar1) {
                                    op_popBack(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)message_name);
                                  }
                                  else {
                                    bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                    if (bVar1) {
                                      op_popFront(in_stack_00000038,in_stack_00000030);
                                    }
                                    else {
                                      bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                      if (bVar1) {
                                        op_popAtIndex(in_stack_000000a8,in_stack_000000a0);
                                      }
                                      else {
                                        bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                        if (bVar1) {
                                          op_insert_beforeIndex(in_stack_000000b8,in_stack_000000b0)
                                          ;
                                        }
                                        else {
                                          bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                          if (bVar1) {
                                            op_eraseFromIndex(in_stack_000000a8,in_stack_000000a0);
                                          }
                                          else {
                                            bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                            if (bVar1) {
                                              op_eraseFromIndex_toIndex
                                                        (in_stack_00000128,in_stack_00000120);
                                            }
                                            else {
                                              bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                              if (bVar1) {
                                                op_removeFirst(in_stack_00000068,in_stack_00000060);
                                              }
                                              else {
                                                bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                if (bVar1) {
                                                  op_removeFirst_fromIndex
                                                            (in_stack_000000d8,in_stack_000000d0);
                                                }
                                                else {
                                                  bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                  if (bVar1) {
                                                    op_removeAll(in_stack_00000058,in_stack_00000050
                                                                );
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                    if (bVar1) {
                                                      op_replaceFirst_with
                                                                (in_stack_00000058,in_stack_00000050
                                                                );
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                      if (bVar1) {
                                                        op_replaceFirst_fromIndex_with
                                                                  (in_stack_000000b8,
                                                                   in_stack_000000b0);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(__lhs,(char *)in_RDI
                                                                               );
                                                        if (bVar1) {
                                                          op_replaceAll_with(in_stack_00000058,
                                                                             in_stack_00000050);
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(__lhs,(char *)
                                                  in_RDI);
                                                  if (bVar1) {
                                                    op_sort((VectorInstance *)arguments,
                                                            in_stack_00000010);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                    if (bVar1) {
                                                      op_reverse((VectorInstance *)arguments,
                                                                 in_stack_00000010);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(__lhs,(char *)in_RDI);
                                                      if (!bVar1) {
                                                        puVar2 = (undefined8 *)
                                                                 __cxa_allocate_exception(8);
                                                        *puVar2 = "RuntimeError: invalid message.";
                                                        __cxa_throw(puVar2,&char_const*::typeinfo,0)
                                                        ;
                                                      }
                                                      op_clear(in_stack_00000008,unaff_retaddr);
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __lhs;
}

Assistant:

std::string VectorInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "isEmpty?")
        return op_isEmpty(arguments);
    if (message_name == "contains?")
        return op_contains(arguments);
    if (message_name == "contains?fromIndex:")
        return op_contains_fromIndex(arguments);
    if (message_name == "count:")
        return op_count(arguments);
    if (message_name == "atIndex:")
        return op_atIndex(arguments);
    if (message_name == "firstIndexOf:")
        return op_firstIndexOf(arguments);
    if (message_name == "firstIndexOf:fromIndex:")
        return op_firstIndexOf_fromIndex(arguments);
    if (message_name == "allIndexesOf:")
        return op_allIndexesOf(arguments);
    if (message_name == "size")
        return op_size(arguments);
    if (message_name == "first:")
        return op_first(arguments);
    if (message_name == "last:")
        return op_last(arguments);
    if (message_name == "sliceFromIndex:")
        return op_sliceFromIndex(arguments);
    if (message_name == "sliceFromIndex:toIndex:")
        return op_sliceFromIndex_toIndex(arguments);
    if (message_name == "pushBack:")
        return op_pushBack(arguments);
    if (message_name == "pushFront:")
        return op_pushFront(arguments);
    if (message_name == "popBack")
        return op_popBack(arguments);
    if (message_name == "popFront")
        return op_popFront(arguments);
    if (message_name == "popAtIndex:")
        return op_popAtIndex(arguments);
    if (message_name == "insert:beforeIndex:")
        return op_insert_beforeIndex(arguments);
    if (message_name == "eraseFromIndex:")
        return op_eraseFromIndex(arguments);
    if (message_name == "eraseFromIndex:toIndex:")
        return op_eraseFromIndex_toIndex(arguments);
    if (message_name == "removeFirst:")
        return op_removeFirst(arguments);
    if (message_name == "removeFirst:fromIndex:")
        return op_removeFirst_fromIndex(arguments);
    if (message_name == "removeAll:")
        return op_removeAll(arguments);
    if (message_name == "replaceFirst:with:")
        return op_replaceFirst_with(arguments);
    if (message_name == "replaceFirst:fromIndex:with:")
        return op_replaceFirst_fromIndex_with(arguments);
    if (message_name == "replaceAll:with:")
        return op_replaceAll_with(arguments);
    if (message_name == "sort")
        return op_sort(arguments);
    if (message_name == "reverse")
        return op_reverse(arguments);
    if (message_name == "clear")
        return op_clear(arguments);
    throw EXC_INVALID_MESSAGE;
}